

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_threadio.c
# Opt level: O3

void INT_CMstart_read_thread(CMConnection_conflict conn)

{
  transport_entry_conflict __src;
  CManager cm;
  int iVar1;
  transport_entry_conflict p_Var2;
  transport_entry_conflict *pp_Var3;
  pthread_t new_thread;
  _transport_item local_d8;
  
  __src = conn->trans;
  p_Var2 = __src;
  if (__src->data_available != (DataAvailableCallback)0x0) {
    cm = conn->cm;
    pp_Var3 = cm->transports;
    p_Var2 = *pp_Var3;
    while (p_Var2 != (transport_entry_conflict)0x0) {
      pp_Var3 = pp_Var3 + 1;
      if (((p_Var2 != __src) && (iVar1 = strcmp(p_Var2->trans_name,__src->trans_name), iVar1 == 0))
         && (p_Var2->data_available == (DataAvailableCallback)0x0)) goto LAB_0012d700;
      p_Var2 = *pp_Var3;
    }
    memcpy(&local_d8,__src,0xb0);
    local_d8.data_available = (DataAvailableCallback)0x0;
    p_Var2 = add_transport_to_cm(cm,&local_d8);
  }
LAB_0012d700:
  conn->trans = p_Var2;
  local_d8.trans_name = (char *)0x0;
  iVar1 = pthread_create((pthread_t *)&local_d8,(pthread_attr_t *)0x0,read_thread_func,conn);
  if ((iVar1 == 0) && (local_d8.trans_name != (char *)0x0)) {
    pthread_detach((pthread_t)local_d8.trans_name);
    return;
  }
  __assert_fail("thread",
                "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm_threadio.c"
                ,0x3e,"void INT_CMstart_read_thread(CMConnection)");
}

Assistant:

void
INT_CMstart_read_thread(CMConnection conn) {
    thr_thread_t thread;
    conn->trans = create_thread_read_transport(conn->cm, conn->trans);
    thread = thr_fork(read_thread_func, (void*)conn);
    assert(thread);
    thr_thread_detach(thread);
}